

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_third_step1.cpp
# Opt level: O0

void __thiscall
ruckig::PositionThirdOrderStep1::time_none_two_step
          (PositionThirdOrderStep1 *this,ProfileIter *profile,double vMax,double vMin,double aMax,
          double aMin,double jMax)

{
  bool bVar1;
  reference pvVar2;
  PositionThirdOrderStep1 *pPVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  double dVar5;
  double h0;
  double jMax_local;
  double aMin_local;
  double aMax_local;
  double vMin_local;
  double vMax_local;
  ProfileIter *profile_local;
  PositionThirdOrderStep1 *this_local;
  
  pPVar3 = this;
  dVar4 = sqrt(jMax * (this->vf - this->v0) + (this->a0_a0 + this->af_af) / 2.0);
  std::abs((int)pPVar3);
  dVar5 = (dVar4 * extraout_XMM0_Qa) / jMax;
  dVar4 = this->a0;
  pvVar2 = std::array<double,_7UL>::operator[](&(*profile)->t,0);
  *pvVar2 = (dVar5 - dVar4) / jMax;
  pvVar2 = std::array<double,_7UL>::operator[](&(*profile)->t,1);
  *pvVar2 = 0.0;
  dVar4 = this->af;
  pvVar2 = std::array<double,_7UL>::operator[](&(*profile)->t,2);
  *pvVar2 = (dVar5 - dVar4) / jMax;
  pvVar2 = std::array<double,_7UL>::operator[](&(*profile)->t,3);
  *pvVar2 = 0.0;
  pvVar2 = std::array<double,_7UL>::operator[](&(*profile)->t,4);
  *pvVar2 = 0.0;
  pvVar2 = std::array<double,_7UL>::operator[](&(*profile)->t,5);
  *pvVar2 = 0.0;
  pvVar2 = std::array<double,_7UL>::operator[](&(*profile)->t,6);
  *pvVar2 = 0.0;
  bVar1 = Profile::check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7,false>
                    (*profile,jMax,vMax,vMin,aMax,aMin);
  if (bVar1) {
    add_profile(this,profile);
  }
  else {
    dVar4 = this->af;
    dVar5 = this->a0;
    pvVar2 = std::array<double,_7UL>::operator[](&(*profile)->t,0);
    *pvVar2 = (dVar4 - dVar5) / jMax;
    pvVar2 = std::array<double,_7UL>::operator[](&(*profile)->t,1);
    *pvVar2 = 0.0;
    pvVar2 = std::array<double,_7UL>::operator[](&(*profile)->t,2);
    *pvVar2 = 0.0;
    pvVar2 = std::array<double,_7UL>::operator[](&(*profile)->t,3);
    *pvVar2 = 0.0;
    pvVar2 = std::array<double,_7UL>::operator[](&(*profile)->t,4);
    *pvVar2 = 0.0;
    pvVar2 = std::array<double,_7UL>::operator[](&(*profile)->t,5);
    *pvVar2 = 0.0;
    pvVar2 = std::array<double,_7UL>::operator[](&(*profile)->t,6);
    *pvVar2 = 0.0;
    bVar1 = Profile::check<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7,false>
                      (*profile,jMax,vMax,vMin,aMax,aMin);
    if (bVar1) {
      add_profile(this,profile);
    }
  }
  return;
}

Assistant:

void PositionThirdOrderStep1::time_none_two_step(ProfileIter& profile, double vMax, double vMin, double aMax, double aMin, double jMax) const {
    // Two step
    {
        const double h0 = std::sqrt((a0_a0 + af_af)/2 + jMax*(vf - v0)) * std::abs(jMax) / jMax;
        profile->t[0] = (h0 - a0)/jMax;
        profile->t[1] = 0;
        profile->t[2] = (h0 - af)/jMax;
        profile->t[3] = 0;
        profile->t[4] = 0;
        profile->t[5] = 0;
        profile->t[6] = 0;

        if (profile->check<ControlSigns::UDDU, ReachedLimits::NONE>(jMax, vMax, vMin, aMax, aMin)) {
            add_profile(profile);
            return;
        }
    }

    // Single step
    {
        profile->t[0] = (af - a0)/jMax;
        profile->t[1] = 0;
        profile->t[2] = 0;
        profile->t[3] = 0;
        profile->t[4] = 0;
        profile->t[5] = 0;
        profile->t[6] = 0;

        if (profile->check<ControlSigns::UDDU, ReachedLimits::NONE>(jMax, vMax, vMin, aMax, aMin)) {
            add_profile(profile);
            return;
        }
    }
}